

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O2

int Ppmd7_DecodeSymbol(CPpmd7 *p,IPpmd7_RangeDec *rc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  Byte *pBVar6;
  UInt16 UVar7;
  uint i;
  UInt32 UVar8;
  int iVar9;
  ulong uVar10;
  CPpmd7_Context *pCVar11;
  CPpmd_See *pCVar12;
  uint uVar13;
  CPpmd_State *pCVar14;
  CPpmd_State **ppCVar15;
  uint uVar16;
  UInt32 UVar17;
  uint uVar18;
  UInt16 *pUVar19;
  byte *pbVar20;
  byte *pbVar21;
  UInt32 freqSum;
  IPpmd7_RangeDec *local_940;
  size_t charMask [32];
  CPpmd_State *ps [256];
  
  pCVar11 = p->MinContext;
  if (pCVar11->NumStats == 1) {
    bVar1 = *(byte *)((long)&pCVar11->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar11->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    pUVar19 = p->BinSumm[(ulong)bVar1 - 1] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 +
              (uint)p->HB2Flag[(byte)pCVar11->SummFreq] * 2);
    UVar8 = (*rc->DecodeBit)(rc,(uint)*pUVar19);
    uVar4 = *pUVar19;
    if (UVar8 == 0) {
      *pUVar19 = (uVar4 - (short)(uVar4 + 0x20 >> 7)) + 0x80;
      p->FoundState = (CPpmd_State *)&p->MinContext->SummFreq;
      UVar7 = p->MinContext->SummFreq;
      Ppmd7_UpdateBin(p);
      return (uint)(byte)UVar7;
    }
    uVar13 = (uint)uVar4 - (uVar4 + 0x20 >> 7);
    *pUVar19 = (ushort)uVar13;
    p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                       [(uVar13 & 0xffff) >> 10];
    for (uVar10 = 0; uVar10 < 0x20; uVar10 = uVar10 + 8) {
      charMask[uVar10] = 0xffffffffffffffff;
      charMask[uVar10 + 1] = 0xffffffffffffffff;
      charMask[uVar10 + 2] = 0xffffffffffffffff;
      charMask[uVar10 + 3] = 0xffffffffffffffff;
      charMask[uVar10 + 4] = 0xffffffffffffffff;
      charMask[uVar10 + 5] = 0xffffffffffffffff;
      charMask[uVar10 + 6] = 0xffffffffffffffff;
      charMask[uVar10 + 7] = 0xffffffffffffffff;
    }
    pCVar11 = p->MinContext;
    *(undefined1 *)((long)charMask + (ulong)(byte)pCVar11->SummFreq) = 0;
    p->PrevSuccess = 0;
  }
  else {
    pBVar6 = p->Base;
    uVar10 = (ulong)pCVar11->Stats;
    UVar8 = (*rc->GetThreshold)(rc,(uint)pCVar11->SummFreq);
    bVar1 = pBVar6[uVar10 + 1];
    if (UVar8 < bVar1) {
      (*rc->Decode)(rc,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar6 + uVar10);
      bVar1 = ((CPpmd_State *)(pBVar6 + uVar10))->Symbol;
      Ppmd7_Update1_0(p);
      return (uint)bVar1;
    }
    p->PrevSuccess = 0;
    iVar9 = p->MinContext->NumStats - 1;
    pbVar21 = pBVar6 + (uVar10 - 6);
    uVar13 = (uint)bVar1;
    do {
      pbVar20 = pbVar21;
      UVar17 = uVar13 + pbVar20[0xd];
      if (UVar8 < UVar17) {
        (*rc->Decode)(rc,uVar13,(uint)pbVar20[0xd]);
        p->FoundState = (CPpmd_State *)(pbVar20 + 0xc);
        bVar1 = pbVar20[0xc];
        Ppmd7_Update1(p);
        return (uint)bVar1;
      }
      pbVar21 = pbVar20 + 6;
      iVar9 = iVar9 + -1;
      uVar13 = UVar17;
    } while (iVar9 != 0);
    uVar13 = (uint)p->MinContext->SummFreq;
    if (uVar13 <= UVar8) {
      return -2;
    }
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    (*rc->Decode)(rc,UVar17,uVar13 - UVar17);
    for (uVar10 = 0; uVar10 < 0x20; uVar10 = uVar10 + 8) {
      charMask[uVar10] = 0xffffffffffffffff;
      charMask[uVar10 + 1] = 0xffffffffffffffff;
      charMask[uVar10 + 2] = 0xffffffffffffffff;
      charMask[uVar10 + 3] = 0xffffffffffffffff;
      charMask[uVar10 + 4] = 0xffffffffffffffff;
      charMask[uVar10 + 5] = 0xffffffffffffffff;
      charMask[uVar10 + 6] = 0xffffffffffffffff;
      charMask[uVar10 + 7] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + (ulong)pbVar20[0xc]) = 0;
    pCVar11 = p->MinContext;
    iVar9 = pCVar11->NumStats - 1;
    do {
      *(undefined1 *)((long)charMask + (ulong)*pbVar21) = 0;
      pbVar21 = pbVar21 + -6;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  while( true ) {
    uVar4 = pCVar11->NumStats;
    uVar13 = p->OrderFall;
    do {
      uVar10 = (ulong)pCVar11->Suffix;
      if (uVar10 == 0) {
        p->OrderFall = uVar13 + 1;
        return -1;
      }
      pBVar6 = p->Base;
      pCVar11 = (CPpmd7_Context *)(pBVar6 + uVar10);
      p->MinContext = pCVar11;
      uVar5 = *(ushort *)(pBVar6 + uVar10);
      uVar13 = uVar13 + 1;
    } while (uVar5 == uVar4);
    p->OrderFall = uVar13;
    pCVar14 = (CPpmd_State *)(pBVar6 + pCVar11->Stats);
    uVar13 = (uint)uVar4;
    uVar18 = 0;
    uVar10 = 0;
    do {
      uVar16 = (uint)*(char *)((long)charMask + (ulong)pCVar14->Symbol);
      uVar18 = uVar18 + (pCVar14->Freq & uVar16);
      ps[uVar10] = pCVar14;
      pCVar14 = pCVar14 + 1;
      uVar16 = (int)uVar10 - uVar16;
      uVar10 = (ulong)uVar16;
    } while (uVar16 != uVar5 - uVar13);
    local_940 = rc;
    pCVar12 = Ppmd7_MakeEscFreq(p,uVar13,&freqSum);
    freqSum = freqSum + uVar18;
    UVar8 = (*local_940->GetThreshold)(local_940,freqSum);
    if (UVar8 < uVar18) break;
    if (freqSum <= UVar8) {
      return -2;
    }
    (*local_940->Decode)(local_940,uVar18,freqSum - uVar18);
    pCVar12->Summ = pCVar12->Summ + (short)freqSum;
    iVar9 = uVar13 - uVar5;
    ppCVar15 = ps + (~uVar13 + (uint)uVar5);
    do {
      *(undefined1 *)((long)charMask + (ulong)(*ppCVar15)->Symbol) = 0;
      ppCVar15 = ppCVar15 + -1;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    pCVar11 = p->MinContext;
    rc = local_940;
  }
  ppCVar15 = ps;
  uVar13 = 0;
  do {
    UVar17 = uVar13;
    pCVar14 = *ppCVar15;
    uVar13 = UVar17 + pCVar14->Freq;
    ppCVar15 = ppCVar15 + 1;
  } while (uVar13 <= UVar8);
  (*local_940->Decode)(local_940,UVar17,(uint)pCVar14->Freq);
  bVar1 = pCVar12->Shift;
  if (bVar1 < 7) {
    pBVar6 = &pCVar12->Count;
    *pBVar6 = *pBVar6 + 0xff;
    if (*pBVar6 == '\0') {
      pCVar12->Summ = pCVar12->Summ << 1;
      pCVar12->Shift = bVar1 + 1;
      pCVar12->Count = (Byte)(3 << (bVar1 & 0x1f));
    }
  }
  p->FoundState = pCVar14;
  bVar1 = pCVar14->Symbol;
  Ppmd7_Update2(p);
  return (uint)bVar1;
}

Assistant:

int Ppmd7_DecodeSymbol(CPpmd7 *p, IPpmd7_RangeDec *rc)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = rc->GetThreshold(rc, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      rc->Decode(rc, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        rc->Decode(rc, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd7_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    rc->Decode(rc, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    if (rc->DecodeBit(rc, *prob) == 0)
    {
      Byte symbol;
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd7Context_OneState(p->MinContext))->Symbol;
      Ppmd7_UpdateBin(p);
      return symbol;
    }
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd7Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd7_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = rc->GetThreshold(rc, freqSum);
    
    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      rc->Decode(rc, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    rc->Decode(rc, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}